

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::CreateDecimalReader<int>(duckdb *this,ParquetReader *reader,ParquetColumnSchema *schema)

{
  char cVar1;
  NotImplementedException *this_00;
  allocator local_39;
  undefined8 local_38 [4];
  
  cVar1 = schema->field_0x29;
  if (cVar1 == '\t') {
    make_uniq<duckdb::TemplatedColumnReader<long,duckdb::TemplatedParquetValueConversion<int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)local_38,reader,schema);
  }
  else if (cVar1 == '\a') {
    make_uniq<duckdb::TemplatedColumnReader<int,duckdb::TemplatedParquetValueConversion<int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)local_38,reader,schema);
  }
  else {
    if (cVar1 != '\x05') {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)local_38,"Unimplemented internal type for CreateDecimalReader",&local_39)
      ;
      duckdb::NotImplementedException::NotImplementedException(this_00,(string *)local_38);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
    make_uniq<duckdb::TemplatedColumnReader<short,duckdb::TemplatedParquetValueConversion<int>>,duckdb::ParquetReader&,duckdb::ParquetColumnSchema_const&>
              ((duckdb *)local_38,reader,schema);
  }
  *(undefined8 *)this = local_38[0];
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
}

Assistant:

unique_ptr<ColumnReader> CreateDecimalReader(ParquetReader &reader, const ParquetColumnSchema &schema) {
	switch (schema.type.InternalType()) {
	case PhysicalType::INT16:
		return make_uniq<TemplatedColumnReader<int16_t, TemplatedParquetValueConversion<T>>>(reader, schema);
	case PhysicalType::INT32:
		return make_uniq<TemplatedColumnReader<int32_t, TemplatedParquetValueConversion<T>>>(reader, schema);
	case PhysicalType::INT64:
		return make_uniq<TemplatedColumnReader<int64_t, TemplatedParquetValueConversion<T>>>(reader, schema);
	default:
		throw NotImplementedException("Unimplemented internal type for CreateDecimalReader");
	}
}